

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_llwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGv_i64 lo;
  TCGv_i64 hi;
  undefined6 in_register_00000012;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o_2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  val = tcg_temp_new_i64(tcg_ctx);
  lo = tcg_temp_new_i64(tcg_ctx);
  hi = tcg_temp_new_i64(tcg_ctx);
  gen_base_offset_addr(ctx,addr,base,0);
  tcg_gen_qemu_ld_i64_mips64el(tcg_ctx,val,addr,(long)ctx->mem_idx,MO_64);
  tcg_gen_extr32_i64_mips64el(tcg_ctx,lo,hi,val);
  gen_store_gpr(tcg_ctx,lo,(int)CONCAT62(in_register_00000012,offset));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(lo + (long)tcg_ctx));
  gen_store_gpr(tcg_ctx,hi,reg1);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(hi + (long)tcg_ctx));
  tcg_gen_st_i64_mips64el(tcg_ctx,val,tcg_ctx->cpu_env,0x790);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  tcg_gen_st_i64_mips64el(tcg_ctx,addr,tcg_ctx->cpu_env,0x780);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_llwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);
    tcg_gen_qemu_ld64(tcg_ctx, tval, taddr, ctx->mem_idx);
#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_extr_i64_tl(tcg_ctx, tmp2, tmp1, tval);
#else
    tcg_gen_extr_i64_tl(tcg_ctx, tmp1, tmp2, tval);
#endif
    gen_store_gpr(tcg_ctx, tmp1, reg1);
    tcg_temp_free(tcg_ctx, tmp1);
    gen_store_gpr(tcg_ctx, tmp2, reg2);
    tcg_temp_free(tcg_ctx, tmp2);
    tcg_gen_st_i64(tcg_ctx, tval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_temp_free_i64(tcg_ctx, tval);
    tcg_gen_st_tl(tcg_ctx, taddr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_temp_free(tcg_ctx, taddr);
}